

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

uint8_t * find_bytes(uint8_t *buffer,size_t bufferSize,uint8_t *pattern,size_t patternSize)

{
  int *piVar1;
  ulong __n;
  
  piVar1 = (int *)memchr(buffer,0,bufferSize);
  if (3 < bufferSize && piVar1 != (int *)0x0) {
    __n = bufferSize - 1;
    do {
      if (*piVar1 == -0x10000) {
        return (uint8_t *)piVar1;
      }
      piVar1 = (int *)memchr((void *)((long)piVar1 + 1),0,__n);
      if (__n < 4) {
        return (uint8_t *)0x0;
      }
      __n = __n - 1;
    } while (piVar1 != (int *)0x0);
  }
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t* find_bytes(
    const uint8_t* buffer, size_t bufferSize, 
    const uint8_t* pattern, size_t patternSize)
{
  const unsigned char *p = buffer;
  size_t buffer_left = bufferSize;
  while ((p = memchr(p, pattern[0], buffer_left)) != NULL)
  {
    if (patternSize > buffer_left)
      break;

    if (memcmp(p, pattern, patternSize) == 0)
      return (uint8_t*)p;

    ++p;
    --buffer_left;
  }

  return NULL;
}